

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::addThisBD(FabArrayBase *this)

{
  int iVar1;
  mapped_type_conflict1 *pmVar2;
  long in_RDI;
  BDKey BVar3;
  int cnt;
  key_type *in_stack_00000018;
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  BVar3 = getBDKey((FabArrayBase *)local_18);
  local_18 = BVar3.m_ba_id.data;
  *(BARef **)(in_RDI + 0xd0) = local_18;
  *(Ref **)(in_RDI + 0xd8) = BVar3.m_dm_id.data.data;
  pmVar2 = std::
           map<amrex::FabArrayBase::BDKey,_int,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_int>_>_>
           ::operator[]((map<amrex::FabArrayBase::BDKey,_int,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_int>_>_>
                         *)this,in_stack_00000018);
  n = (int)((ulong)in_RDI >> 0x20);
  iVar1 = *pmVar2 + 1;
  *pmVar2 = iVar1;
  if (iVar1 == 1) {
    std::
    map<amrex::FabArrayBase::BDKey,_int,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_int>_>_>
    ::size((map<amrex::FabArrayBase::BDKey,_int,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_int>_>_>
            *)0x12af8f1);
    FabArrayStats::recordMaxNumBoxArrays
              ((FabArrayStats *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),n);
  }
  else {
    FabArrayStats::recordMaxNumBAUse((FabArrayStats *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),n);
  }
  return;
}

Assistant:

void
FabArrayBase::addThisBD ()
{
    m_bdkey = getBDKey();
    int cnt = ++(m_BD_count[m_bdkey]);
    if (cnt == 1) { // new one
        m_FA_stats.recordMaxNumBoxArrays(m_BD_count.size());
    } else {
        m_FA_stats.recordMaxNumBAUse(cnt);
    }
}